

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

baseHolder * __thiscall cs_impl::any::holder<cs::type_t>::duplicate(holder<cs::type_t> *this)

{
  holder<cs::type_t> *this_00;
  
  if ((DAT_0033e748 == 0) || (cs::global_thread_counter != 0)) {
    this_00 = (holder<cs::type_t> *)operator_new(0x48);
  }
  else {
    this_00 = *(holder<cs::type_t> **)
               (&holder<cni_root_namespace::foo_t>::allocator + DAT_0033e748 * 8);
    DAT_0033e748 = DAT_0033e748 + -1;
  }
  holder<cs::type_t&>(this_00,&this->mDat);
  return &this_00->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}